

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lex.cpp
# Opt level: O0

void __thiscall luna::Lexer::LexSingleLineComment(Lexer *this)

{
  int iVar1;
  Lexer *in_RDI;
  bool bVar2;
  
  while( true ) {
    bVar2 = false;
    if ((in_RDI->current_ != 0xd) && (bVar2 = false, in_RDI->current_ != 10)) {
      bVar2 = in_RDI->current_ != -1;
    }
    if (!bVar2) break;
    iVar1 = Next(in_RDI);
    in_RDI->current_ = iVar1;
  }
  return;
}

Assistant:

void Lexer::LexSingleLineComment()
    {
        while (current_ != '\r' && current_ != '\n' && current_ != EOF)
            current_ = Next();
    }